

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O3

int __thiscall
IDisk::FindEndOfWeakArea
          (IDisk *this,int side,int track,uint *current_search_revolution,uint *next_correct_index,
          uint nb_used_revolutions,int *rev_to_use,bool *revolution_wrecked)

{
  uint uVar1;
  Revolution *pRVar2;
  uchar *puVar3;
  uchar *puVar4;
  int iVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  Side *pSVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  bool bVar22;
  bool bVar23;
  int inner_revolution_to_use;
  IDisk *local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  uint ending_search [16];
  int tmp_buffer [16];
  uint inner_search_end [16];
  
  if (nb_used_revolutions != 0) {
    local_108 = (ulong)nb_used_revolutions;
    uVar13 = (ulong)nb_used_revolutions;
    uVar7 = 0xffffffff;
    uVar10 = 0;
    do {
      if (revolution_wrecked[uVar10] == false) {
        ending_search[uVar10] = next_correct_index[uVar10];
        if (uVar7 == 0xffffffff) {
          uVar7 = (uint)uVar10;
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar13 != uVar10);
    if (uVar7 == 0xffffffff) {
      return 0;
    }
    uVar1 = ending_search[(int)uVar7];
    uVar12 = current_search_revolution[(int)uVar7];
    iVar8 = uVar1 - uVar12;
    if (iVar8 == 0xe) {
      return 0;
    }
    pSVar16 = this->side_ + side;
    local_100 = (ulong)(nb_used_revolutions - 1);
    local_118 = (ulong)uVar7;
    uVar14 = 0;
    uVar17 = 0;
    do {
      if (((uVar1 < uVar12 + 0xe) || (ending_search[(int)uVar7] - uVar12 <= uVar17)) ||
         (iVar8 - uVar17 <= uVar14)) break;
      uVar12 = uVar12 + uVar17;
      tmp_buffer[(int)uVar7] = uVar12;
      if (nb_used_revolutions != 0) {
        uVar10 = 0;
        do {
          if (local_118 != uVar10) {
            tmp_buffer[uVar10] = -1;
          }
          uVar10 = uVar10 + 1;
        } while (uVar13 != uVar10);
        if (nb_used_revolutions != 0) {
          iVar8 = uVar17 - 0x40;
          if (uVar17 < 0x40) {
            iVar8 = 0;
          }
          uVar10 = 0;
          do {
            if ((uVar10 != local_118) && (revolution_wrecked[uVar10] == false)) {
              uVar9 = uVar17 + 0x40 + current_search_revolution[uVar10];
              uVar20 = current_search_revolution[uVar10] + iVar8;
              uVar21 = ending_search[uVar10] - 0xf;
              if (uVar9 < ending_search[uVar10] - 0xf) {
                uVar21 = uVar9;
              }
              if (uVar20 < uVar21) {
                pRVar2 = pSVar16->tracks[track].revolution;
                uVar15 = (ulong)uVar20;
                do {
                  if ((uVar12 + 0xe < pRVar2[(int)uVar7].size) &&
                     (iVar5 = (int)uVar15, iVar5 + 0xeU < pRVar2[uVar10].size)) {
                    puVar3 = pRVar2[(int)uVar7].bitfield;
                    puVar4 = pRVar2[uVar10].bitfield;
                    if (*(long *)(puVar3 + (ulong)uVar12 + 6) != *(long *)(puVar4 + uVar15 + 6) ||
                        *(long *)(puVar3 + uVar12) != *(long *)(puVar4 + uVar15)) {
                      bVar23 = true;
                      uVar11 = 0;
                      do {
                        bVar23 = (bool)(bVar23 & puVar3[uVar12 + (int)uVar11] ==
                                                 puVar4[(uint)((int)uVar11 + iVar5)]);
                        bVar22 = uVar11 < 0xc;
                        uVar11 = uVar11 + 2;
                      } while (bVar22);
                      if (!bVar23) goto LAB_0014b5d9;
                    }
                    tmp_buffer[uVar10] = iVar5;
                    break;
                  }
LAB_0014b5d9:
                  uVar15 = uVar15 + 1;
                } while (uVar15 < uVar21);
              }
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != uVar13);
          if (nb_used_revolutions != 1) {
            bVar6 = 1;
            uVar10 = 1;
            do {
              if (revolution_wrecked[uVar10] == false) {
                bVar6 = bVar6 & tmp_buffer[uVar10] != -1;
              }
              uVar10 = uVar10 + 1;
            } while (uVar13 != uVar10);
            if ((bool)(~bVar6 & 1) || nb_used_revolutions == 0) goto LAB_0014b7ca;
          }
          uVar15 = 0xffffffff;
          lVar18 = 1;
          uVar12 = 0;
          uVar10 = 0;
          do {
            uVar11 = uVar10 + 1;
            if (uVar11 < uVar13) {
              lVar19 = lVar18;
              do {
                if ((revolution_wrecked[uVar10] == false) && (revolution_wrecked[lVar19] == false))
                {
                  uVar9 = next_correct_index[uVar10] - tmp_buffer[uVar10];
                  uVar21 = next_correct_index[lVar19] - tmp_buffer[lVar19];
                  if (uVar9 <= uVar21) {
                    uVar21 = uVar9;
                  }
                  pRVar2 = pSVar16->tracks[track].revolution;
                  uVar9 = 0;
                  do {
                    uVar20 = uVar9 + 2;
                    if (pRVar2[uVar10].bitfield[tmp_buffer[uVar10] + uVar9] !=
                        pRVar2[lVar19].bitfield[tmp_buffer[lVar19] + uVar9]) break;
                    uVar9 = uVar20;
                  } while (uVar20 <= uVar21);
                  if (uVar9 < uVar21) {
                    uVar21 = uVar9;
                  }
                  bVar23 = uVar12 < uVar21;
                  if (uVar12 <= uVar21) {
                    uVar12 = uVar21;
                  }
                  if (bVar23) {
                    uVar15 = uVar10 & 0xffffffff;
                  }
                }
                lVar19 = lVar19 + 1;
              } while ((uint)lVar19 != nb_used_revolutions);
            }
            lVar18 = lVar18 + 1;
            uVar10 = uVar11;
          } while (uVar11 != uVar13);
          if ((uVar14 < uVar12) &&
             (*rev_to_use = (int)uVar15, uVar14 = uVar12, nb_used_revolutions != 0)) {
            lVar18 = 8;
            uVar10 = 0;
            do {
              if (revolution_wrecked[uVar10] == false) {
                ending_search[uVar10] = tmp_buffer[uVar10] + uVar12;
                uVar21 = *(uint *)((long)&(pSVar16->tracks[track].revolution)->bitfield + lVar18);
                if (uVar21 < tmp_buffer[uVar10] + uVar12) {
                  if (local_100 == uVar10) {
                    revolution_wrecked[uVar10] = true;
                  }
                  else {
                    ending_search[uVar10] = uVar21;
                  }
                }
              }
              uVar10 = uVar10 + 1;
              lVar18 = lVar18 + 0x30;
            } while (uVar13 != uVar10);
          }
        }
      }
LAB_0014b7ca:
      uVar17 = uVar17 + 1;
      uVar12 = current_search_revolution[(int)uVar7];
      iVar8 = uVar1 - uVar12;
    } while (uVar17 < iVar8 - 0xeU);
    if (uVar14 != 0) {
      if (nb_used_revolutions != 0) {
        uVar10 = 0;
        do {
          if (revolution_wrecked[uVar10] == false) {
            next_correct_index[uVar10] = ending_search[uVar10];
          }
          uVar10 = uVar10 + 1;
        } while (uVar13 != uVar10);
        if (nb_used_revolutions != 0) {
          uVar10 = 0;
          do {
            if (revolution_wrecked[uVar10] == false) {
              inner_search_end[uVar10] = ending_search[uVar10] - uVar14;
            }
            uVar10 = uVar10 + 1;
          } while (uVar13 != uVar10);
        }
      }
      inner_revolution_to_use = -1;
      local_120 = this;
      local_110 = uVar13;
      uVar7 = FindEndOfWeakArea(this,side,track,current_search_revolution,inner_search_end,
                                nb_used_revolutions,&inner_revolution_to_use,revolution_wrecked);
      if (uVar7 == 0) {
        return uVar14;
      }
      if (nb_used_revolutions != 0) {
        uVar10 = 0;
        do {
          if (revolution_wrecked[uVar10] == false) {
            next_correct_index[uVar10] = inner_search_end[uVar10];
          }
          uVar10 = uVar10 + 1;
        } while (uVar13 != uVar10);
      }
      *rev_to_use = inner_revolution_to_use;
      return uVar7;
    }
  }
  return 0;
}

Assistant:

int IDisk::FindEndOfWeakArea(int side, int track, unsigned int* current_search_revolution, unsigned int* next_correct_index,
                             unsigned int nb_used_revolutions, int* rev_to_use, bool revolution_wrecked[16])
{
   // Init : The ending is, by default, pNextCorrectIndex
   unsigned int ending_search[16];
   unsigned int best_count = 0;
   int tmp_buffer[16];

   int refrev = -1;

   for (unsigned int rev = 0; rev < nb_used_revolutions; rev++)
   {
      if (!revolution_wrecked[rev])
      {
         ending_search[rev] = next_correct_index[rev];
         if (refrev == -1)
            refrev = rev;
      }
   }

   if (refrev == -1) return 0;

   // Rev0 is the reference.
   unsigned int maxRev0 = ending_search[refrev];

   for (unsigned int index = 0; index < maxRev0 - current_search_revolution[refrev] - RECOVER_SIZE
        && index < (ending_search[refrev] - current_search_revolution[refrev])
        && best_count < maxRev0 - current_search_revolution[refrev] - index
        && (maxRev0 >= (current_search_revolution[refrev] + RECOVER_SIZE)); index++)
   {
      tmp_buffer[refrev] = index + current_search_revolution[refrev];
      for (unsigned int i = 0; i < nb_used_revolutions; i++) { if (refrev != i) tmp_buffer[i] = -1; }
      for (unsigned int rev = 0; rev < nb_used_revolutions; rev++)
      {
         if (refrev != rev && !revolution_wrecked[rev])
         {
            // Walk every reference until we find something that is same (at least 14 bits correct)
            unsigned int min = (index < MOVING_AREA)
                                  ? (current_search_revolution[rev])
                                  : (current_search_revolution[rev] + index - MOVING_AREA);
            unsigned int max = current_search_revolution[rev] + index + MOVING_AREA;
            if (max > ending_search[rev] - RECOVER_SIZE - 1) max = ending_search[rev] - RECOVER_SIZE - 1;
            bool found = false;
            for (unsigned int i = min; i < max && !found; i++)
            {
               if (side_[side].tracks[track].revolution[refrev].size <= current_search_revolution[refrev] + index + RECOVER_SIZE
                  || side_[side].tracks[track].revolution[rev].size <= i + RECOVER_SIZE)
               {
                  found = false;
               }
               else
               {
                  if (memcmp(&side_[side].tracks[track].revolution[refrev].bitfield[current_search_revolution[refrev] + index],
                             &side_[side].tracks[track].revolution[rev].bitfield[i], RECOVER_SIZE) == 0)
                  {
                     tmp_buffer[rev] = i;
                     found = true;
                  }
                     // Half (one on 2) is the same - For all those dump with half datas (clock or data)
                  else
                  {
                     bool ok = true;
                     for (int i2 = 0; i2 < RECOVER_SIZE; i2 += 2)
                     {
                        if (side_[side].tracks[track].revolution[refrev].bitfield[current_search_revolution[refrev] + index + i2
                           ] != side_[side].tracks[track].revolution[rev].bitfield[i + i2]
                        )
                        {
                           ok = false;
                        }
                     }
                     if (ok)
                     {
                        tmp_buffer[rev] = i;
                        found = true;
                        // Only half is correct
                     }
                  }
               }
            }
         }
      }

      // All Tmp != 0 ?
      bool ok = true;
      for (unsigned int rev = 1; rev < nb_used_revolutions; rev++)
      {
         if (!revolution_wrecked[rev] && (tmp_buffer[rev] == -1))
         {
            ok = false;
         }
      }
      // Found ! Count how many bits are correct.
      if (ok)
      {
         unsigned int count = 0;
         int revolution_count = -1;
         int bit_corrects[16][16];
         for (unsigned int i = 0; i < nb_used_revolutions; i++)
         {
            for (unsigned int j = i + 1; j < nb_used_revolutions; j++)
            {
               if (!revolution_wrecked[i] && !revolution_wrecked[j])
               {
                  // Comparaison des revolutions i et j
                  bool revolution_comp_ok = true;
                  bit_corrects[i][j] = 0;
                  unsigned int localcount = 0;
                  // Max comp : pTmp -> pNextCorrectIndex
                  unsigned int max_comp_1 = next_correct_index[i] - tmp_buffer[i];
                  unsigned int max_comp_2 = next_correct_index[j] - tmp_buffer[j];
                  unsigned int min_comp = std::min(max_comp_1, max_comp_2);

                  while (revolution_comp_ok && localcount <= min_comp)
                  {
                     // Compare
                     if (side_[side].tracks[track].revolution[i].bitfield[tmp_buffer[i] + localcount] != side_[side].tracks[
                        track].revolution[j].bitfield[tmp_buffer[j] + localcount])
                     {
                        revolution_comp_ok = false;
                     }
                     else
                     {
                        localcount += 2;
                     }
                  }
                  if (localcount > min_comp) localcount = min_comp;
                  bit_corrects[i][j] = localcount;
                  if (count < localcount)
                  {
                     count = localcount;
                     revolution_count = i;
                  }
               }
            }
         }

         // Better than the previous one ?
         if (count > best_count)
         {
            // Yes : set it as the best candidate
            best_count = count;
            *rev_to_use = revolution_count;
            // In all case, set the end of the search to the end of this set
            for (unsigned int rev = 0; rev < nb_used_revolutions; rev++)
            {
               if (!revolution_wrecked[rev])
               {
                  ending_search[rev] = tmp_buffer[rev] + count;
                  if (ending_search[rev] > side_[side].tracks[track].revolution[rev].size)
                  {
                     if (rev == nb_used_revolutions - 1)
                        revolution_wrecked[rev] = true;
                     else
                        ending_search[rev] = side_[side].tracks[track].revolution[rev].size;
                  }
               }
            }
         }
      }
   }

   if (best_count > 0)
   {
      for (unsigned int rev = 0; rev < nb_used_revolutions; rev++)
      {
         if (!revolution_wrecked[rev])
            next_correct_index[rev] = ending_search[rev];
      }

      // Check recursively for inner area search, from initial current_search_revolution to pEndingSearch-bestCount
      unsigned int inner_search_end[16];
      for (unsigned int rev = 0; rev < nb_used_revolutions; rev++)
      {
         if (!revolution_wrecked[rev])
            inner_search_end[rev] = ending_search[rev] - best_count;
      }

      int inner_revolution_to_use = -1;
      int inner_best_count = FindEndOfWeakArea(side, track, current_search_revolution, inner_search_end, nb_used_revolutions,
                                             &inner_revolution_to_use, revolution_wrecked);
      if (inner_best_count != 0)
      {
         // Return these datas
         for (unsigned int rev = 0; rev < nb_used_revolutions; rev++)
         {
            if (!revolution_wrecked[rev])
               next_correct_index[rev] = inner_search_end[rev];
         }
         *rev_to_use = inner_revolution_to_use;

         return inner_best_count;
      }
      // Nothing found : Return our datas
      return best_count;
   }
   return best_count;
}